

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O1

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,any *v)

{
  bool bVar1;
  char cVar2;
  ValueType VVar3;
  int iVar4;
  object obj;
  undefined1 local_58 [32];
  float local_38;
  size_t local_30;
  __node_base_ptr ap_Stack_28 [2];
  
  bVar1 = Json::Value::isBool(this->json);
  if (bVar1) {
    bVar1 = Json::Value::asBool(this->json);
    local_58[0] = bVar1;
    any::operator=(v,(boolean *)local_58);
  }
  else {
    VVar3 = Json::Value::type(this->json);
    if (VVar3 == realValue) {
      local_58._0_8_ = Json::Value::asDouble(this->json);
      any::operator=(v,(number *)local_58);
      return true;
    }
    bVar1 = Json::Value::isInt64(this->json);
    if (bVar1) {
      local_58._0_8_ = Json::Value::asInt64(this->json);
      any::operator=(v,(integer *)local_58);
      return true;
    }
    bVar1 = Json::Value::isString(this->json);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_((String *)local_58,this->json);
      any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                    );
      if ((undefined1 *)local_58._0_8_ == local_58 + 0x10) {
        return true;
      }
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      return true;
    }
    bVar1 = Json::Value::isObject(this->json);
    if (bVar1) {
      local_58._0_8_ = ap_Stack_28;
      local_58._8_8_ = &DAT_00000001;
      local_58._16_8_ = 0;
      local_58._24_8_ = 0;
      local_38 = 1.0;
      local_30 = 0;
      ap_Stack_28[0] = (__node_base_ptr)0x0;
      iVar4 = (*(this->super_Deserializer)._vptr_Deserializer[6])(this,local_58);
      cVar2 = (char)iVar4;
      if (cVar2 == '\0') {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_58);
        return false;
      }
      any::operator=(v,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                        *)local_58);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_58);
    }
    else {
      bVar1 = Json::Value::isArray(this->json);
      if (!bVar1) {
        bVar1 = Json::Value::isNull(this->json);
        if (!bVar1) {
          return false;
        }
        local_58._0_8_ = (pointer)0x0;
        any::operator=(v,(nullptr_t *)local_58);
        return true;
      }
      local_58._0_8_ = (pointer)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_58._16_8_ = 0;
      cVar2 = deserialize<dap::any>(this,(array<dap::any> *)local_58);
      if (!(bool)cVar2) {
        std::vector<dap::any,_std::allocator<dap::any>_>::~vector
                  ((vector<dap::any,_std::allocator<dap::any>_> *)local_58);
        return false;
      }
      any::operator=(v,(vector<dap::any,_std::allocator<dap::any>_> *)local_58);
      std::vector<dap::any,_std::allocator<dap::any>_>::~vector
                ((vector<dap::any,_std::allocator<dap::any>_> *)local_58);
    }
    if (cVar2 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::any* v) const {
  if (json->isBool()) {
    *v = dap::boolean(json->asBool());
  } else if (json->type() == Json::ValueType::realValue) {
    // json->isDouble() returns true for integers as well, so we need to
    // explicitly look for the realValue type.
    *v = dap::number(json->asDouble());
  } else if (json->isInt64()) {
    *v = dap::integer(json->asInt64());
  } else if (json->isString()) {
    *v = json->asString();
  } else if (json->isObject()) {
    dap::object obj;
    if (!deserialize(&obj)) {
      return false;
    }
    *v = obj;
  } else if (json->isArray()) {
    dap::array<any> arr;
    if (!deserialize(&arr)) {
      return false;
    }
    *v = arr;
  } else if (json->isNull()) {
    *v = null();
  } else {
    return false;
  }
  return true;
}